

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::StartMouseMovingWindow(ImGuiWindow *window)

{
  ImGuiDockNode *pIVar1;
  bool bVar2;
  ImGuiContext *pIVar3;
  ImVec2 IVar4;
  ImGuiDockNode *node;
  bool can_move_window;
  ImGuiContext *g;
  ImGuiWindow *window_local;
  
  pIVar3 = GImGui;
  FocusWindow(window);
  SetActiveID(window->MoveId,window);
  pIVar3->NavDisableHighlight = true;
  IVar4 = ::operator-((pIVar3->IO).MouseClickedPos,&window->RootWindowDockTree->Pos);
  pIVar3->ActiveIdClickOffset = IVar4;
  pIVar3->ActiveIdNoClearOnFocusLoss = true;
  SetActiveIdUsingNavAndKeys();
  bVar2 = true;
  if (((window->Flags & 4U) != 0) || ((window->RootWindowDockTree->Flags & 4U) != 0)) {
    bVar2 = false;
  }
  pIVar1 = window->DockNodeAsHost;
  if (((pIVar1 != (ImGuiDockNode *)0x0) && (pIVar1->VisibleWindow != (ImGuiWindow *)0x0)) &&
     ((pIVar1->VisibleWindow->Flags & 4U) != 0)) {
    bVar2 = false;
  }
  if (bVar2) {
    pIVar3->MovingWindow = window;
  }
  return;
}

Assistant:

void ImGui::StartMouseMovingWindow(ImGuiWindow* window)
{
    // Set ActiveId even if the _NoMove flag is set. Without it, dragging away from a window with _NoMove would activate hover on other windows.
    // We _also_ call this when clicking in a window empty space when io.ConfigWindowsMoveFromTitleBarOnly is set, but clear g.MovingWindow afterward.
    // This is because we want ActiveId to be set even when the window is not permitted to move.
    ImGuiContext& g = *GImGui;
    FocusWindow(window);
    SetActiveID(window->MoveId, window);
    g.NavDisableHighlight = true;
    g.ActiveIdClickOffset = g.IO.MouseClickedPos[0] - window->RootWindowDockTree->Pos;
    g.ActiveIdNoClearOnFocusLoss = true;
    SetActiveIdUsingNavAndKeys();

    bool can_move_window = true;
    if ((window->Flags & ImGuiWindowFlags_NoMove) || (window->RootWindowDockTree->Flags & ImGuiWindowFlags_NoMove))
        can_move_window = false;
    if (ImGuiDockNode* node = window->DockNodeAsHost)
        if (node->VisibleWindow && (node->VisibleWindow->Flags & ImGuiWindowFlags_NoMove))
            can_move_window = false;
    if (can_move_window)
        g.MovingWindow = window;
}